

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperMatch.c
# Opt level: O2

void Map_NodeTryDroppingOnePhase(Map_Man_t *p,Map_Node_t *pNode)

{
  float *pfVar1;
  float fVar2;
  Map_Cut_t *pCut;
  bool bVar3;
  int iVar4;
  int fPhase;
  Map_Cut_t *pMVar5;
  bool bVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  pMVar5 = pNode->pCutBest[0];
  if (pMVar5 == (Map_Cut_t *)0x0) {
    return;
  }
  pCut = pNode->pCutBest[1];
  if (pCut == (Map_Cut_t *)0x0) {
    return;
  }
  iVar4 = p->fMappingMode;
  if (iVar4 == 1) {
    return;
  }
  fVar8 = Map_TimeMatchWithInverter(p,pCut->M + 1);
  fVar9 = Map_TimeMatchWithInverter(p,pMVar5->M);
  if ((iVar4 == 0) && (p->DelayTarget <= 1e+09 && p->DelayTarget != 1e+09)) {
    if (fVar8 + p->fEpsilon < pMVar5->M[0].tArrive.Worst) {
      pNode->pCutBest[0] = (Map_Cut_t *)0x0;
      return;
    }
    if (pCut->M[1].tArrive.Worst <= fVar9 + p->fEpsilon) {
      return;
    }
    pNode->pCutBest[1] = (Map_Cut_t *)0x0;
    return;
  }
  if (pNode->nRefAct[0] == 0) {
    return;
  }
  if (pNode->nRefAct[1] == 0) {
    return;
  }
  if (iVar4 - 3U < 2) {
    fVar2 = pNode->tRequired[0].Worst;
    bVar3 = fVar9 + p->fEpsilon < pNode->tRequired[1].Worst;
    fVar8 = fVar8 + p->fEpsilon;
    bVar7 = fVar2 == fVar8;
    bVar6 = fVar2 < fVar8;
LAB_003667dc:
    bVar7 = !bVar6 && !bVar7;
  }
  else {
    if (iVar4 == 2) {
      fVar2 = pNode->tRequired[0].Worst;
      fVar10 = (p->pSuperLib->tDelayInv).Worst * 3.0;
      bVar3 = fVar9 + fVar10 + p->fEpsilon < pNode->tRequired[1].Worst;
      fVar8 = fVar10 + fVar8 + p->fEpsilon;
      bVar7 = fVar2 == fVar8;
      bVar6 = fVar2 < fVar8;
      goto LAB_003667dc;
    }
    bVar7 = false;
    bVar3 = false;
  }
  if ((bVar3 == false) && (bVar7 == false)) {
    return;
  }
  if ((bVar3 & bVar7) == 1) {
    fVar8 = pCut->M[1].AreaFlow;
    pfVar1 = &pMVar5->M[0].AreaFlow;
    if (fVar8 < *pfVar1 || fVar8 == *pfVar1) {
LAB_00366889:
      if (0 < pNode->nRefAct[0] && 1 < iVar4) {
        Map_CutDeref(pMVar5,0,p->fUseProfile);
        iVar4 = p->fMappingMode;
      }
      pNode->pCutBest[0] = (Map_Cut_t *)0x0;
      if (iVar4 < 2) {
        return;
      }
      if (pNode->nRefAct[1] != 0) {
        return;
      }
      pMVar5 = pNode->pCutBest[1];
      iVar4 = p->fUseProfile;
      fPhase = 1;
      goto LAB_003668d9;
    }
  }
  else {
    if (bVar7 == bVar3) {
      __assert_fail("fUsePhase0 ^ fUsePhase1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperMatch.c"
                    ,0x1ec,"void Map_NodeTryDroppingOnePhase(Map_Man_t *, Map_Node_t *)");
    }
    if (bVar3 == false) goto LAB_00366889;
  }
  if (0 < pNode->nRefAct[1] && 1 < iVar4) {
    Map_CutDeref(pCut,1,p->fUseProfile);
    iVar4 = p->fMappingMode;
  }
  pNode->pCutBest[1] = (Map_Cut_t *)0x0;
  if ((iVar4 < 2) || (pNode->nRefAct[0] != 0)) {
    return;
  }
  pMVar5 = pNode->pCutBest[0];
  iVar4 = p->fUseProfile;
  fPhase = 0;
LAB_003668d9:
  Map_CutRef(pMVar5,fPhase,iVar4);
  return;
}

Assistant:

void Map_NodeTryDroppingOnePhase( Map_Man_t * p, Map_Node_t * pNode )
{
    Map_Match_t * pMatchBest0, * pMatchBest1;
    float tWorst0Using1, tWorst1Using0; 
    int fUsePhase1, fUsePhase0;

    // nothing to do if one of the phases is already dropped
    if ( pNode->pCutBest[0] == NULL || pNode->pCutBest[1] == NULL )
        return;

    // do not drop while recovering area flow
    if ( p->fMappingMode == 1 )//|| p->fMappingMode == 2 )
        return;

    // get the pointers to the matches of the best cuts
    pMatchBest0 = pNode->pCutBest[0]->M + 0;
    pMatchBest1 = pNode->pCutBest[1]->M + 1;

    // get the worst arrival times of each phase
    // implemented using the other phase with inverter added
    tWorst0Using1 = Map_TimeMatchWithInverter( p, pMatchBest1 );
    tWorst1Using0 = Map_TimeMatchWithInverter( p, pMatchBest0 );

    // consider the case of mapping for delay
    if ( p->fMappingMode == 0 && p->DelayTarget < ABC_INFINITY )
    { 
        // if the arrival time of a phase is larger than the arrival time 
        // of the opposite phase plus the inverter, drop this phase
        if ( pMatchBest0->tArrive.Worst > tWorst0Using1 + p->fEpsilon ) 
            pNode->pCutBest[0] = NULL;
        else if ( pMatchBest1->tArrive.Worst > tWorst1Using0 + p->fEpsilon ) 
            pNode->pCutBest[1] = NULL;
        return;
    }

    // do not perform replacement if one of the phases is unused
    if ( pNode->nRefAct[0] == 0 || pNode->nRefAct[1] == 0 )
        return;
 
    // check if replacement of each phase is possible using required times
    fUsePhase0 = fUsePhase1 = 0;
    if ( p->fMappingMode == 2 )
    {
        fUsePhase0 = (pNode->tRequired[1].Worst > tWorst1Using0 + 3*p->pSuperLib->tDelayInv.Worst + p->fEpsilon);
        fUsePhase1 = (pNode->tRequired[0].Worst > tWorst0Using1 + 3*p->pSuperLib->tDelayInv.Worst + p->fEpsilon);
    }
    else if ( p->fMappingMode == 3 || p->fMappingMode == 4 )
    {
        fUsePhase0 = (pNode->tRequired[1].Worst > tWorst1Using0 + p->fEpsilon);
        fUsePhase1 = (pNode->tRequired[0].Worst > tWorst0Using1 + p->fEpsilon);
    }
    if ( !fUsePhase0 && !fUsePhase1 )
        return;

    // if replacement is possible both ways, use the one that works better
    if ( fUsePhase0 && fUsePhase1 )
    {
        if ( pMatchBest0->AreaFlow < pMatchBest1->AreaFlow )
            fUsePhase1 = 0;
        else
            fUsePhase0 = 0;
    }
    // only one phase should be used
    assert( fUsePhase0 ^ fUsePhase1 );

    // set the corresponding cut to NULL
    if ( fUsePhase0 )
    {
        // deref phase 1 cut if necessary
        if ( p->fMappingMode >= 2 && pNode->nRefAct[1] > 0 )
            Map_CutDeref( pNode->pCutBest[1], 1, p->fUseProfile );
        // get rid of the cut
        pNode->pCutBest[1] = NULL;
        // ref phase 0 cut if necessary
        if ( p->fMappingMode >= 2 && pNode->nRefAct[0] == 0 )
            Map_CutRef( pNode->pCutBest[0], 0, p->fUseProfile );
    }
    else
    {
        // deref phase 0 cut if necessary
        if ( p->fMappingMode >= 2 && pNode->nRefAct[0] > 0 )
            Map_CutDeref( pNode->pCutBest[0], 0, p->fUseProfile );
        // get rid of the cut
        pNode->pCutBest[0] = NULL;
        // ref phase 1 cut if necessary
        if ( p->fMappingMode >= 2 && pNode->nRefAct[1] == 0 )
            Map_CutRef( pNode->pCutBest[1], 1, p->fUseProfile );
    }
}